

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O1

void Fra_FraigNode(Fra_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  int iVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Aig_Obj_t *pNew;
  Aig_Obj_t *pOld;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCore.c"
                  ,0xee,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
  }
  pvVar2 = (pObj->field_5).pData;
  pAVar3 = *(Aig_Obj_t **)(*(long *)(*(long *)((long)pvVar2 + 0x30) + 8) + (long)pObj->Id * 8);
  if (pAVar3 == (Aig_Obj_t *)0x0) {
    return;
  }
  if ((p->pPars->fDoSparse == 0) && (pAVar3 == p->pManAig->pConst1)) {
    return;
  }
  iVar5 = p->pPars->nFramesK;
  uVar4 = *(ulong *)(*(long *)((long)(pAVar3->field_5).pData + 0x20) +
                    (long)(pAVar3->Id * *(int *)((long)(pAVar3->field_5).pData + 0x18) + iVar5) * 8)
  ;
  pNew = (Aig_Obj_t *)
         (*(ulong *)(*(long *)((long)pvVar2 + 0x20) +
                    (long)(pObj->Id * *(int *)((long)pvVar2 + 0x18) + iVar5) * 8) &
         0xfffffffffffffffe);
  pOld = (Aig_Obj_t *)(uVar4 & 0xfffffffffffffffe);
  if (pNew == pOld) {
    p->nSatCallsSkipped = p->nSatCallsSkipped + 1;
    return;
  }
  if ((iVar5 == 0) && (p->pManFraig->pConst1 == pNew)) {
    __assert_fail("p->pPars->nFramesK || Aig_Regular(pObjFraig) != Aig_ManConst1(p->pManFraig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCore.c"
                  ,0xfe,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
  }
  iVar5 = Fra_NodesAreEquiv(p,pOld,pNew);
  if (iVar5 == -1) {
    if (p->vTimeouts == (Vec_Ptr_t *)0x0) {
      pVVar6 = (Vec_Ptr_t *)malloc(0x10);
      pVVar6->nCap = 100;
      pVVar6->nSize = 0;
      ppvVar7 = (void **)malloc(800);
      pVVar6->pArray = ppvVar7;
      p->vTimeouts = pVVar6;
    }
    pVVar6 = p->vTimeouts;
    uVar1 = pVVar6->nCap;
    if (pVVar6->nSize == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pVVar6->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
        }
        pVVar6->pArray = ppvVar7;
        iVar5 = 0x10;
      }
      else {
        iVar5 = uVar1 * 2;
        if (iVar5 <= (int)uVar1) goto LAB_0068cebb;
        if (pVVar6->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
        }
        pVVar6->pArray = ppvVar7;
      }
      pVVar6->nCap = iVar5;
    }
LAB_0068cebb:
    iVar5 = pVVar6->nSize;
    pVVar6->nSize = iVar5 + 1;
    pVVar6->pArray[iVar5] = pObj;
    if (p->pPars->fSpeculate == 0) {
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCore.c"
                  ,0x111,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
  }
  if (iVar5 == 1) {
    *(ulong *)(*(long *)((long)(pObj->field_5).pData + 0x20) +
              ((long)pObj->Id * (long)*(int *)((long)(pObj->field_5).pData + 0x18) +
              (long)p->pPars->nFramesK) * 8) =
         (*(uint *)&pAVar3->field_0x18 ^ *(uint *)&pObj->field_0x18) >> 3 & 1 ^ uVar4;
    return;
  }
  p->pCla->fRefinement = 1;
  pVVar6 = p->vTimeouts;
  if (pVVar6 == (Vec_Ptr_t *)0x0) goto LAB_0068cf21;
  uVar1 = pVVar6->nCap;
  if (pVVar6->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar7;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_0068cf0b;
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar1 << 4);
      }
      pVVar6->pArray = ppvVar7;
    }
    pVVar6->nCap = iVar5;
  }
LAB_0068cf0b:
  iVar5 = pVVar6->nSize;
  pVVar6->nSize = iVar5 + 1;
  pVVar6->pArray[iVar5] = pObj;
LAB_0068cf21:
  Fra_SmlResimulate(p);
  if (p->pManFraig->pData != (void *)0x0) {
    return;
  }
  if ((p->pPars->nFramesK == 0) &&
     (*(Aig_Obj_t **)
       (*(long *)(*(long *)((long)(pObj->field_5).pData + 0x30) + 8) + (long)pObj->Id * 8) == pAVar3
     )) {
    puts("Fra_FraigNode(): Error in class refinement!");
  }
  if (p->pPars->nFramesK != 0) {
    return;
  }
  if (*(Aig_Obj_t **)
       (*(long *)(*(long *)((long)(pObj->field_5).pData + 0x30) + 8) + (long)pObj->Id * 8) != pAVar3
     ) {
    return;
  }
  __assert_fail("p->pPars->nFramesK || Fra_ClassObjRepr(pObj) != pObjRepr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraCore.c"
                ,0x128,"void Fra_FraigNode(Fra_Man_t *, Aig_Obj_t *)");
}

Assistant:

static inline void Fra_FraigNode( Fra_Man_t * p, Aig_Obj_t * pObj )
{ 
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    assert( !Aig_IsComplement(pObj) );
    // get representative of this class
    pObjRepr = Fra_ClassObjRepr( pObj );
    if ( pObjRepr == NULL || // this is a unique node
       (!p->pPars->fDoSparse && pObjRepr == Aig_ManConst1(p->pManAig)) ) // this is a sparse node
        return;
    // get the fraiged node
    pObjFraig = Fra_ObjFraig( pObj, p->pPars->nFramesK );
    // get the fraiged representative
    pObjReprFraig = Fra_ObjFraig( pObjRepr, p->pPars->nFramesK );
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
    {
        p->nSatCallsSkipped++;
        return;
    }
    assert( p->pPars->nFramesK || Aig_Regular(pObjFraig) != Aig_ManConst1(p->pManFraig) );
    // if they are proved different, the c-ex will be in p->pPatWords
    RetValue = Fra_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    if ( RetValue == 1 )  // proved equivalent
    {
//        if ( p->pPars->fChoicing )
//            Aig_ObjCreateRepr( p->pManFraig, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
        // the nodes proved equal
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjFraig2 );
        return;
    }
    if ( RetValue == -1 ) // failed
    {
        if ( p->vTimeouts == NULL )
            p->vTimeouts = Vec_PtrAlloc( 100 );
        Vec_PtrPush( p->vTimeouts, pObj );
        if ( !p->pPars->fSpeculate )
            return;
        assert( 0 );
        // speculate
        p->nSpeculs++;
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Fra_ObjSetFraig( pObj, p->pPars->nFramesK, pObjFraig2 );
        Fra_FraigNodeSpeculate( p, pObj, Aig_Regular(pObjFraig), Aig_Regular(pObjReprFraig) );
        return;
    }
    // disprove the nodes
    p->pCla->fRefinement = 1;
    // if we do not include the node into those disproved, we may end up 
    // merging this node with another representative, for which proof has timed out
    if ( p->vTimeouts )
        Vec_PtrPush( p->vTimeouts, pObj );
    // verify that the counter-example satisfies all the constraints
//    if ( p->vCex )
//        Fra_FraigVerifyCounterEx( p, p->vCex );
    // simulate the counter-example and return the Fraig node
    Fra_SmlResimulate( p );
    if ( p->pManFraig->pData )
        return;
    if ( !p->pPars->nFramesK && Fra_ClassObjRepr(pObj) == pObjRepr )
        printf( "Fra_FraigNode(): Error in class refinement!\n" );
    assert( p->pPars->nFramesK || Fra_ClassObjRepr(pObj) != pObjRepr );
}